

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
SetIsPrototype(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
               *this,DynamicObject *instance,bool hasNewType)

{
  Type *addr;
  byte bVar1;
  Type *pTVar2;
  DynamicType *oldType;
  PropertyRecord *propertyKey;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  undefined4 *puVar6;
  RecyclerWeakReference<Js::DynamicObject> *pRVar7;
  PropertyRecord **ppPVar8;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  int index;
  anon_class_8_1_0902ba13 local_50;
  anon_class_8_1_0902ba13 setFixedFlags;
  
  while( true ) {
    bVar1 = (this->super_DynamicTypeHandler).flags;
    local_50.instance = instance;
    if (((bVar1 & 0x18) == 0) || (DAT_015d6345 != '\x01')) break;
    pTVar2 = (instance->super_RecyclableObject).type.ptr;
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
    hasNewType = (instance->super_RecyclableObject).type.ptr != pTVar2;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  oldSingletonInstanceBefore = GetSingletonInstance(this);
  TraceFixedFieldsBeforeSetIsProto
            (instance,&this->super_DynamicTypeHandler,oldType,oldSingletonInstanceBefore);
  setFixedFlags.instance = (DynamicObject *)oldType;
  if ((hasNewType == false) && (DAT_015d6346 == '\x01')) {
    bVar4 = DynamicObject::HasSharedType(instance);
    if ((bVar4) &&
       ((*(byte *)(*(long *)((instance->super_RecyclableObject).type.ptr + 1) + 9) & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xb92,
                                  "(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared())"
                                  ,
                                  "!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared()"
                                 );
      if (!bVar4) goto LAB_00e08196;
      *puVar6 = 0;
    }
    DynamicObject::ChangeType(instance);
    bVar4 = DynamicObject::HasSharedType(instance);
    hasNewType = true;
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xb95,"(!instance->HasSharedType())","!instance->HasSharedType()"
                                 );
      if (!bVar4) goto LAB_00e08196;
      *puVar6 = 0;
    }
  }
  if ((bVar1 & 0x10) == 0) {
    pRVar7 = (this->singletonInstance).ptr;
    if ((pRVar7 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar7->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xb9c,
                                  "(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || this->singletonInstance->Get() == instance"
                                 );
      if (!bVar4) goto LAB_00e08196;
      *puVar6 = 0;
    }
    addr = &this->singletonInstance;
    bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((!bVar4) && (addr->ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xb9d,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar4) {
LAB_00e08196:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((bVar4) && (addr->ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      pRVar7 = DynamicObject::CreateWeakReferenceToSelf(instance);
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pRVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    }
    BVar5 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
    if ((BVar5 == 0) && (this_00 = (this->propertyMap).ptr, 0 < this_00->count - this_00->freeCount)
       ) {
      index = 0;
      do {
        ppPVar8 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt(this_00,index);
        propertyKey = *ppPVar8;
        descriptor = JsUtil::
                     BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                     ::GetReferenceAt((this->propertyMap).ptr,index);
        SetIsPrototype::anon_class_8_1_0902ba13::operator()
                  (&local_50,propertyKey,descriptor,hasNewType);
        index = index + 1;
        this_00 = (this->propertyMap).ptr;
      } while (index < this_00->count - this_00->freeCount);
    }
  }
  DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,' ');
  TraceFixedFieldsAfterSetIsProto
            (instance,&this->super_DynamicTypeHandler,&this->super_DynamicTypeHandler,
             (DynamicType *)setFixedFlags.instance,oldSingletonInstanceBefore);
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetIsPrototype(DynamicObject* instance, bool hasNewType)
    {
#if ENABLE_FIXED_FIELDS
        const auto setFixedFlags = [instance](TMapKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* const descriptor, bool hasNewType)
        {
            if (TPropertyKey_IsInternalPropertyId(propertyKey))
            {
                return;
            }
            if (!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal))
            {
                // See PathTypeHandlerBase::ConvertToSimpleDictionaryType for rules governing fixed field bits during type
                // handler transitions.  In addition, we know that the current instance is not yet a prototype.
                if (descriptor->propertyIndex != NoSlots)
                {
                    // Consider: If we decide to fix all types of properties, we could skip loading the value from the instance.
                    if (descriptor->isInitialized)
                    {
                        Var value = instance->GetSlot(descriptor->propertyIndex);
                        // Even though the handler says the property is initialized the particular instance may not yet have
                        // a value for this property.  This should only happen if the handler is shared.
                        if (value != nullptr)
                        {
                            if (hasNewType)
                            {
                                // Since we have a non-shared type handler, it's ok to fix all fields at their current values, as long as
                                // we've also taken a type transition.  Otherwise populated load field caches would still be valid and
                                // would need to be explicitly invalidated if the property value changes.

                                // saravind:If the instance is used by a CrossSiteObject, then we are conservative and do not mark any field as fixed in that instance.
                                // We need to relax this in the future and support fixed fields for Cross Site Context usage
                                descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));

                                // Since we have a new type we can clear all used as fixed bits.  That's because any instance field loads
                                // will have been invalidated by the type transition, and there are no proto fields loads from this object
                                // because it is just now becoming a proto.
                                descriptor->usedAsFixed = false;
                            }
                        }
                    }
                    else
                    {
                        Assert(!descriptor->isFixed && !descriptor->usedAsFixed);
                    }
                }
            }
        };

        bool isShared = GetIsShared();
#endif
        if (GetIsOrMayBecomeShared() && IsolatePrototypes())
        {
            Type* oldType = instance->GetType();
            ConvertToNonSharedSimpleDictionaryType(instance)->SetIsPrototype(instance, instance->GetType() != oldType);
        }
        else
        {

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = instance->GetDynamicType();
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeSetIsProto(instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (!hasNewType && ChangeTypeOnProto())
            {
                // We're about to split out the type.  If the original type was shared the handler better be shared as well.
                // Otherwise, the handler would lose track of being shared between different types and instances.
                Assert(!instance->HasSharedType() || instance->GetDynamicType()->GetTypeHandler()->GetIsShared());
                // Forcing a type transition allows us to fix all fields (even those that were previously marked as non-fixed).
                instance->ChangeType();
                Assert(!instance->HasSharedType());
                hasNewType = true;
            }

#if ENABLE_FIXED_FIELDS
            if (!isShared)
            {
                Assert(this->singletonInstance == nullptr || this->singletonInstance->Get() == instance);
                Assert(HasSingletonInstanceOnlyIfNeeded());
                if (AreSingletonInstancesNeeded() && this->singletonInstance == nullptr)
                {
                    this->singletonInstance = instance->CreateWeakReferenceToSelf();
                }

                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                if (!instance->IsExternal())
                {
                    // If this type handler is not shared by any types or instances we can simply mark all existing properties as fixed.
                    // The propertyMap dictionary is guaranteed to have contiguous entries because we never remove entries from it.
                    for (int i = 0; i < propertyMap->Count(); i++)
                    {
                        TMapKey propertyKey = propertyMap->GetKeyAt(i);
                        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* const descriptor = propertyMap->GetReferenceAt(i);
                        setFixedFlags(propertyKey, descriptor, hasNewType);
                    }
                }
            }
#endif

            SetFlags(IsPrototypeFlag);

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterSetIsProto(instance, this, this, oldType, oldSingletonInstance);
#endif
#endif
        }
    }